

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall detail::reader::operator()(reader *this,string *val)

{
  char *pcVar1;
  ulong uVar2;
  const_buffer cVar3;
  void *local_68;
  size_t local_60;
  allocator local_41;
  string local_40 [38];
  unsigned_short local_1a;
  string *psStack_18;
  uint16_t length;
  string *val_local;
  reader *this_local;
  
  local_1a = 0;
  psStack_18 = val;
  val_local = (string *)this;
  operator()(this,&local_1a);
  pcVar1 = boost::asio::buffer_cast<char_const*>(&this->buf_);
  uVar2 = (ulong)local_1a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar1,uVar2,&local_41);
  std::__cxx11::string::operator=((string *)psStack_18,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  cVar3 = boost::asio::operator+(&this->buf_,(ulong)local_1a);
  local_68 = cVar3.data_;
  (this->buf_).data_ = local_68;
  local_60 = cVar3.size_;
  (this->buf_).size_ = local_60;
  return;
}

Assistant:

void operator()(std::string& val) const {
        uint16_t length = 0;
        (*this)(length);
        val = std::string(asio::buffer_cast<char const*>(buf_), length);
        buf_ = buf_ + length;
    }